

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_acquire(command_conflict *cmd)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  char *prompt;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t great;
  wchar_t n;
  command_conflict *cmd_local;
  
  _great = cmd;
  wVar2 = cmd_get_arg_choice((command *)cmd,"choice",&local_18);
  if (wVar2 != L'\0') {
    _Var1 = get_check("Acquire great objects? ");
    local_18 = (wchar_t)_Var1;
    cmd_set_arg_choice((command *)_great,"choice",local_18);
  }
  wVar2 = cmd_get_arg_number((command *)_great,"quantity",&local_14);
  if (wVar2 != L'\0') {
    prompt = "How many good objects? ";
    if (local_18 != L'\0') {
      prompt = "How many great objects? ";
    }
    local_14 = get_quantity(prompt,L'(');
    if (local_14 < L'\x01') {
      return;
    }
    cmd_set_arg_number((command *)_great,"quantity",local_14);
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  acquirement(grid,(int)player->depth,local_14,local_18 != L'\0');
  return;
}

Assistant:

void do_cmd_wiz_acquire(struct command *cmd)
{
	int n, great;

	if (cmd_get_arg_choice(cmd, "choice", &great) != CMD_OK) {
		great = (get_check("Acquire great objects? ")) ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", great);
	}

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity((great) ?
			"How many great objects? " : "How many good objects? ",
			40);
		if (n < 1) return;
		cmd_set_arg_number(cmd, "quantity", n);
	}

	acquirement(player->grid, player->depth, n, great);
}